

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::SceneLoader::end__value____common_float_or_param_type(SceneLoader *this)

{
  KinematicsFloatOrParam::setParamValue
            (&this->mCurrentBindJointAxis->mValue,&this->mCurrentCharacterData);
  (this->mCurrentCharacterData)._M_string_length = 0;
  *(this->mCurrentCharacterData)._M_dataplus._M_p = '\0';
  return true;
}

Assistant:

bool SceneLoader::end__value____common_float_or_param_type()
	{
		mCurrentBindJointAxis->getValue().setParamValue(mCurrentCharacterData);
		mCurrentCharacterData.clear();
		return true;
	}